

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv_test.cc
# Opt level: O2

void __thiscall
leveldb::MemEnvTest_OverwriteOpenFile_Test::~MemEnvTest_OverwriteOpenFile_Test
          (MemEnvTest_OverwriteOpenFile_Test *this)

{
  MemEnvTest::~MemEnvTest(&this->super_MemEnvTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(MemEnvTest, OverwriteOpenFile) {
  const char kWrite1Data[] = "Write #1 data";
  const size_t kFileDataLen = sizeof(kWrite1Data) - 1;
  const std::string kTestFileName = testing::TempDir() + "leveldb-TestFile.dat";

  ASSERT_LEVELDB_OK(WriteStringToFile(env_, kWrite1Data, kTestFileName));

  RandomAccessFile* rand_file;
  ASSERT_LEVELDB_OK(env_->NewRandomAccessFile(kTestFileName, &rand_file));

  const char kWrite2Data[] = "Write #2 data";
  ASSERT_LEVELDB_OK(WriteStringToFile(env_, kWrite2Data, kTestFileName));

  // Verify that overwriting an open file will result in the new file data
  // being read from files opened before the write.
  Slice result;
  char scratch[kFileDataLen];
  ASSERT_LEVELDB_OK(rand_file->Read(0, kFileDataLen, &result, scratch));
  ASSERT_EQ(0, result.compare(kWrite2Data));

  delete rand_file;
}